

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

void Nwk_ManGraphUpdate(Nwk_Grf_t *p,Nwk_Vrt_t *pVertex,Nwk_Vrt_t *pNext)

{
  Nwk_Vrt_t *pNVar1;
  Nwk_Vrt_t *pNVar2;
  int local_38;
  int local_34;
  int k;
  int i;
  Nwk_Vrt_t *pOther;
  Nwk_Vrt_t *pChanged;
  Nwk_Vrt_t *pNext_local;
  Nwk_Vrt_t *pVertex_local;
  Nwk_Grf_t *p_local;
  
  Nwk_ManGraphListExtract(p,pVertex);
  Nwk_ManGraphListExtract(p,pNext);
  for (local_34 = 0; local_34 < pVertex->nEdges; local_34 = local_34 + 1) {
    pNVar1 = p->pVerts[(&pVertex[1].Id)[local_34]];
    if (pNVar1 != pNext) {
      Nwk_ManGraphListExtract(p,pNVar1);
      if (1 < pNVar1->nEdges) {
        for (local_38 = 0; local_38 < pNVar1->nEdges; local_38 = local_38 + 1) {
          pNVar2 = p->pVerts[(&pNVar1[1].Id)[local_38]];
          if ((pNVar2 != pVertex) && (pNVar2->nEdges < 2)) {
            if (pNVar2->nEdges != 1) {
              __assert_fail("pOther->nEdges == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                            ,0x1df,"void Nwk_ManGraphUpdate(Nwk_Grf_t *, Nwk_Vrt_t *, Nwk_Vrt_t *)")
              ;
            }
            Nwk_ManGraphListExtract(p,pNVar2);
            pNVar1->nEdges = pNVar1->nEdges + -1;
            Nwk_ManGraphListInsert(p,pNVar2);
            pNVar1->nEdges = pNVar1->nEdges + 1;
          }
        }
      }
      Nwk_ManGraphVertexRemoveEdge(pNVar1,pVertex);
      if (0 < pNVar1->nEdges) {
        Nwk_ManGraphListInsert(p,pNVar1);
      }
    }
  }
  local_34 = 0;
  do {
    if (pNext->nEdges <= local_34) {
      if (pVertex->Id < pNext->Id) {
        Vec_IntPush(p->vPairs,p->pMapId2Lut[pVertex->Id]);
        Vec_IntPush(p->vPairs,p->pMapId2Lut[pNext->Id]);
      }
      else {
        Vec_IntPush(p->vPairs,p->pMapId2Lut[pNext->Id]);
        Vec_IntPush(p->vPairs,p->pMapId2Lut[pVertex->Id]);
      }
      return;
    }
    pNVar1 = p->pVerts[(&pNext[1].Id)[local_34]];
    if (pNVar1 != pVertex) {
      Nwk_ManGraphListExtract(p,pNVar1);
      if (1 < pNVar1->nEdges) {
        for (local_38 = 0; local_38 < pNVar1->nEdges; local_38 = local_38 + 1) {
          pNVar2 = p->pVerts[(&pNVar1[1].Id)[local_38]];
          if ((pNVar2 != pNext) && (pNVar2->nEdges < 2)) {
            if (pNVar2->nEdges != 1) {
              __assert_fail("pOther->nEdges == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                            ,0x1f7,"void Nwk_ManGraphUpdate(Nwk_Grf_t *, Nwk_Vrt_t *, Nwk_Vrt_t *)")
              ;
            }
            Nwk_ManGraphListExtract(p,pNVar2);
            pNVar1->nEdges = pNVar1->nEdges + -1;
            Nwk_ManGraphListInsert(p,pNVar2);
            pNVar1->nEdges = pNVar1->nEdges + 1;
          }
        }
      }
      Nwk_ManGraphVertexRemoveEdge(pNVar1,pNext);
      if (0 < pNVar1->nEdges) {
        Nwk_ManGraphListInsert(p,pNVar1);
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void Nwk_ManGraphUpdate( Nwk_Grf_t * p, Nwk_Vrt_t * pVertex, Nwk_Vrt_t * pNext )
{
    Nwk_Vrt_t * pChanged, * pOther;
    int i, k;
//    Nwk_ManGraphCheckLists( p );
    Nwk_ManGraphListExtract( p, pVertex );
    Nwk_ManGraphListExtract( p, pNext );
    // update neihbors of pVertex
    Nwk_VertexForEachAdjacent( p, pVertex, pChanged, i )
    {
        if ( pChanged == pNext )
            continue;
        Nwk_ManGraphListExtract( p, pChanged );
        // move those that use this one
        if ( pChanged->nEdges > 1 )
        Nwk_VertexForEachAdjacent( p, pChanged, pOther, k )
        {
            if ( pOther == pVertex || pOther->nEdges > 1 )
                continue;
            assert( pOther->nEdges == 1 );
            Nwk_ManGraphListExtract( p, pOther );
            pChanged->nEdges--;
            Nwk_ManGraphListInsert( p, pOther );
            pChanged->nEdges++;
        }
        // remove the edge
        Nwk_ManGraphVertexRemoveEdge( pChanged, pVertex );
        // add the changed vertex back
        if ( pChanged->nEdges > 0 )
            Nwk_ManGraphListInsert( p, pChanged );
    }
    // update neihbors of pNext
    Nwk_VertexForEachAdjacent( p, pNext, pChanged, i )
    {
        if ( pChanged == pVertex )
            continue;
        Nwk_ManGraphListExtract( p, pChanged );
        // move those that use this one
        if ( pChanged->nEdges > 1 )
        Nwk_VertexForEachAdjacent( p, pChanged, pOther, k )
        {
            if ( pOther == pNext || pOther->nEdges > 1 )
                continue;
            assert( pOther->nEdges == 1 );
            Nwk_ManGraphListExtract( p, pOther );
            pChanged->nEdges--;
            Nwk_ManGraphListInsert( p, pOther );
            pChanged->nEdges++;
        }
        // remove the edge
        Nwk_ManGraphVertexRemoveEdge( pChanged, pNext );
        // add the changed vertex back
        if ( pChanged->nEdges > 0 )
            Nwk_ManGraphListInsert( p, pChanged );
    }
    // add to the result
    if ( pVertex->Id < pNext->Id )
    {
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pVertex->Id] ); 
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pNext->Id] ); 
    }
    else
    {
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pNext->Id] ); 
        Vec_IntPush( p->vPairs, p->pMapId2Lut[pVertex->Id] ); 
    }
//    Nwk_ManGraphCheckLists( p );
}